

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_DESTRUCTION(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int y;
  int x;
  player_state_conflict state;
  player_state_conflict state_00;
  loc_conflict grid_00;
  loc grid2;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc grid1;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc_conflict grid_09;
  loc_conflict grid_10;
  loc_conflict grid_11;
  loc_conflict grid_12;
  loc_conflict grid_13;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  loc lVar7;
  square_conflict *psVar8;
  long lVar9;
  player_state_conflict *ppVar10;
  undefined8 *puVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined1 in_stack_fffffffffffffe58 [312];
  object *local_48;
  object *obj;
  wchar_t local_34;
  wchar_t wStack_30;
  loc_conflict grid;
  wchar_t px;
  wchar_t py;
  wchar_t elem;
  wchar_t r;
  wchar_t k;
  effect_handler_context_t *context_local;
  
  bVar12 = 0;
  wVar1 = context->radius;
  wVar2 = context->subtype;
  y = (player->grid).y;
  x = (player->grid).x;
  context->ident = true;
  if ((player->depth == 0) || ((player->upkeep->arena_level & 1U) != 0)) {
    msg("The ground shakes for a moment.");
  }
  else {
    for (wStack_30 = y - wVar1; wStack_30 <= y + wVar1; wStack_30 = wStack_30 + L'\x01') {
      for (local_34 = x - wVar1; local_34 <= x + wVar1; local_34 = local_34 + L'\x01') {
        grid_00.y = wStack_30;
        grid_00.x = local_34;
        _Var4 = square_in_bounds_fully((chunk *)cave,grid_00);
        if (_Var4) {
          lVar7 = loc(x,y);
          grid2.y = wStack_30;
          grid2.x = local_34;
          wVar5 = distance(lVar7,grid2);
          if (wVar5 <= wVar1) {
            grid_01.y = wStack_30;
            grid_01.x = local_34;
            psVar8 = square((chunk *)cave,grid_01);
            flag_off(psVar8->info,3,4);
            grid_02.y = wStack_30;
            grid_02.x = local_34;
            psVar8 = square((chunk *)cave,grid_02);
            flag_off(psVar8->info,3,3);
            grid_03.y = wStack_30;
            grid_03.x = local_34;
            _Var4 = square_isbright((chunk *)cave,grid_03);
            if (!_Var4) {
              grid_04.y = wStack_30;
              grid_04.x = local_34;
              psVar8 = square((chunk *)cave,grid_04);
              flag_off(psVar8->info,3,2);
            }
            grid_05.y = wStack_30;
            grid_05.x = local_34;
            psVar8 = square((chunk *)cave,grid_05);
            flag_off(psVar8->info,3,5);
            grid_06.y = wStack_30;
            grid_06.x = local_34;
            square_forget((chunk *)cave,grid_06);
            lVar7.y = wStack_30;
            lVar7.x = local_34;
            square_light_spot((chunk *)cave,lVar7);
            grid1.y = wStack_30;
            grid1.x = local_34;
            _Var4 = loc_eq(grid1,player->grid);
            if (!_Var4) {
              grid_07.y = wStack_30;
              grid_07.x = local_34;
              delete_monster((chunk *)cave,grid_07);
              grid_08.y = wStack_30;
              grid_08.x = local_34;
              _Var4 = square_ispermanent((chunk *)cave,grid_08);
              if (!_Var4) {
                grid_09.y = wStack_30;
                grid_09.x = local_34;
                for (local_48 = square_object((chunk *)cave,grid_09); local_48 != (object *)0x0;
                    local_48 = local_48->next) {
                  if (local_48->artifact != (artifact *)0x0) {
                    if ((((player->opts).opt[0x23] & 1U) != 0) ||
                       (_Var4 = obj_is_known_artifact(local_48), _Var4)) {
                      history_lose_artifact(player,local_48->artifact);
                      mark_artifact_created(local_48->artifact,true);
                    }
                    else {
                      mark_artifact_created(local_48->artifact,false);
                    }
                  }
                }
                grid_10.y = wStack_30;
                grid_10.x = local_34;
                square_excise_all_imagined((chunk *)player->cave,(chunk *)cave,grid_10);
                grid_11.y = wStack_30;
                grid_11.x = local_34;
                square_excise_pile((chunk *)player->cave,grid_11);
                grid_12.y = wStack_30;
                grid_12.x = local_34;
                square_excise_pile((chunk *)cave,grid_12);
                grid_13.y = wStack_30;
                grid_13.x = local_34;
                square_destroy((chunk *)cave,grid_13);
              }
            }
          }
        }
      }
    }
    if (wVar2 == L'\x05') {
      msg("There is a searing blast of light!");
      equip_learn_element(player,L'\x05');
      ppVar10 = &player->state;
      puVar11 = (undefined8 *)&stack0xfffffffffffffe58;
      for (lVar9 = 0x27; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar11 = *(undefined8 *)ppVar10->stat_add;
        ppVar10 = (player_state_conflict *)((long)ppVar10 + (ulong)bVar12 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      state._312_4_ = *(undefined4 *)&(player->state).el_info[0x1b].flags;
      uVar13 = in_stack_fffffffffffffe58._202_4_;
      uVar14 = in_stack_fffffffffffffe58._206_4_;
      uVar15 = in_stack_fffffffffffffe58._210_4_;
      uVar16 = in_stack_fffffffffffffe58._214_4_;
      uVar17 = in_stack_fffffffffffffe58._218_4_;
      uVar18 = in_stack_fffffffffffffe58._222_4_;
      uVar19 = in_stack_fffffffffffffe58._226_4_;
      uVar20 = in_stack_fffffffffffffe58._230_4_;
      uVar21 = in_stack_fffffffffffffe58._234_4_;
      uVar22 = in_stack_fffffffffffffe58._238_4_;
      uVar23 = in_stack_fffffffffffffe58._242_4_;
      uVar24 = in_stack_fffffffffffffe58._246_4_;
      uVar25 = in_stack_fffffffffffffe58._250_4_;
      uVar26 = in_stack_fffffffffffffe58._254_4_;
      uVar27 = in_stack_fffffffffffffe58._258_4_;
      uVar28 = in_stack_fffffffffffffe58._262_4_;
      uVar29 = in_stack_fffffffffffffe58._266_4_;
      uVar30 = in_stack_fffffffffffffe58._270_4_;
      uVar31 = in_stack_fffffffffffffe58._274_4_;
      uVar32 = in_stack_fffffffffffffe58._278_4_;
      uVar33 = in_stack_fffffffffffffe58._282_4_;
      uVar34 = in_stack_fffffffffffffe58._286_4_;
      uVar35 = in_stack_fffffffffffffe58._290_4_;
      uVar36 = in_stack_fffffffffffffe58._294_4_;
      uVar37 = in_stack_fffffffffffffe58._298_4_;
      uVar38 = in_stack_fffffffffffffe58._302_4_;
      uVar39 = in_stack_fffffffffffffe58._306_4_;
      state.stat_add[0] = in_stack_fffffffffffffe58._0_4_;
      state.stat_add[1] = in_stack_fffffffffffffe58._4_4_;
      state.stat_add[2] = in_stack_fffffffffffffe58._8_4_;
      state.stat_add[3] = in_stack_fffffffffffffe58._12_4_;
      state.stat_add[4] = in_stack_fffffffffffffe58._16_4_;
      state.stat_ind[0] = in_stack_fffffffffffffe58._20_4_;
      state.stat_ind[1] = in_stack_fffffffffffffe58._24_4_;
      state.stat_ind[2] = in_stack_fffffffffffffe58._28_4_;
      state.stat_ind[3] = in_stack_fffffffffffffe58._32_4_;
      state.stat_ind[4] = in_stack_fffffffffffffe58._36_4_;
      state.stat_use[0] = in_stack_fffffffffffffe58._40_4_;
      state.stat_use[1] = in_stack_fffffffffffffe58._44_4_;
      state.stat_use[2] = in_stack_fffffffffffffe58._48_4_;
      state.stat_use[3] = in_stack_fffffffffffffe58._52_4_;
      state.stat_use[4] = in_stack_fffffffffffffe58._56_4_;
      state.stat_top[0] = in_stack_fffffffffffffe58._60_4_;
      state.stat_top[1] = in_stack_fffffffffffffe58._64_4_;
      state.stat_top[2] = in_stack_fffffffffffffe58._68_4_;
      state.stat_top[3] = in_stack_fffffffffffffe58._72_4_;
      state.stat_top[4] = in_stack_fffffffffffffe58._76_4_;
      state.skills[0] = in_stack_fffffffffffffe58._80_4_;
      state.skills[1] = in_stack_fffffffffffffe58._84_4_;
      state.skills[2] = in_stack_fffffffffffffe58._88_4_;
      state.skills[3] = in_stack_fffffffffffffe58._92_4_;
      state.skills[4] = in_stack_fffffffffffffe58._96_4_;
      state.skills[5] = in_stack_fffffffffffffe58._100_4_;
      state.skills[6] = in_stack_fffffffffffffe58._104_4_;
      state.skills[7] = in_stack_fffffffffffffe58._108_4_;
      state.skills[8] = in_stack_fffffffffffffe58._112_4_;
      state.skills[9] = in_stack_fffffffffffffe58._116_4_;
      state.speed = in_stack_fffffffffffffe58._120_4_;
      state.num_blows = in_stack_fffffffffffffe58._124_4_;
      state.num_shots = in_stack_fffffffffffffe58._128_4_;
      state.num_moves = in_stack_fffffffffffffe58._132_4_;
      state.ammo_mult = in_stack_fffffffffffffe58._136_4_;
      state.ammo_tval = in_stack_fffffffffffffe58._140_4_;
      state.ac = in_stack_fffffffffffffe58._144_4_;
      state.dam_red = in_stack_fffffffffffffe58._148_4_;
      state.perc_dam_red = in_stack_fffffffffffffe58._152_4_;
      state.to_a = in_stack_fffffffffffffe58._156_4_;
      state.to_h = in_stack_fffffffffffffe58._160_4_;
      state.to_d = in_stack_fffffffffffffe58._164_4_;
      state.see_infra = in_stack_fffffffffffffe58._168_4_;
      state.cur_light = in_stack_fffffffffffffe58._172_4_;
      state.evasion_chance = in_stack_fffffffffffffe58._176_4_;
      state.shield_on_back = (_Bool)in_stack_fffffffffffffe58[0xb4];
      state.heavy_wield = (_Bool)in_stack_fffffffffffffe58[0xb5];
      state.heavy_shoot = (_Bool)in_stack_fffffffffffffe58[0xb6];
      state.bless_wield = (_Bool)in_stack_fffffffffffffe58[0xb7];
      state.cumber_armor = (_Bool)in_stack_fffffffffffffe58[0xb8];
      state.flags[0] = in_stack_fffffffffffffe58[0xb9];
      state.flags[1] = in_stack_fffffffffffffe58[0xba];
      state.flags[2] = in_stack_fffffffffffffe58[0xbb];
      state.flags[3] = in_stack_fffffffffffffe58[0xbc];
      state.flags[4] = in_stack_fffffffffffffe58[0xbd];
      state.flags[5] = in_stack_fffffffffffffe58[0xbe];
      state.pflags[0] = in_stack_fffffffffffffe58[0xbf];
      state.pflags[1] = in_stack_fffffffffffffe58[0xc0];
      state.pflags[2] = in_stack_fffffffffffffe58[0xc1];
      state.pflags[3] = in_stack_fffffffffffffe58[0xc2];
      state.pflags[4] = in_stack_fffffffffffffe58[0xc3];
      state.pflags[5] = in_stack_fffffffffffffe58[0xc4];
      state.pflags[6] = in_stack_fffffffffffffe58[0xc5];
      state.pflags[7] = in_stack_fffffffffffffe58[0xc6];
      state.pflags[8] = in_stack_fffffffffffffe58[199];
      state.pflags[9] = in_stack_fffffffffffffe58[200];
      state._201_1_ = in_stack_fffffffffffffe58[0xc9];
      state.el_info[0].res_level = (short)uVar13;
      state.el_info[0].flags = (char)((uint)uVar13 >> 0x10);
      state.el_info[0]._3_1_ = (char)((uint)uVar13 >> 0x18);
      state.el_info[1].res_level = (short)uVar14;
      state.el_info[1].flags = (char)((uint)uVar14 >> 0x10);
      state.el_info[1]._3_1_ = (char)((uint)uVar14 >> 0x18);
      state.el_info[2].res_level = (short)uVar15;
      state.el_info[2].flags = (char)((uint)uVar15 >> 0x10);
      state.el_info[2]._3_1_ = (char)((uint)uVar15 >> 0x18);
      state.el_info[3].res_level = (short)uVar16;
      state.el_info[3].flags = (char)((uint)uVar16 >> 0x10);
      state.el_info[3]._3_1_ = (char)((uint)uVar16 >> 0x18);
      state.el_info[4].res_level = (short)uVar17;
      state.el_info[4].flags = (char)((uint)uVar17 >> 0x10);
      state.el_info[4]._3_1_ = (char)((uint)uVar17 >> 0x18);
      state.el_info[5].res_level = (short)uVar18;
      state.el_info[5].flags = (char)((uint)uVar18 >> 0x10);
      state.el_info[5]._3_1_ = (char)((uint)uVar18 >> 0x18);
      state.el_info[6].res_level = (short)uVar19;
      state.el_info[6].flags = (char)((uint)uVar19 >> 0x10);
      state.el_info[6]._3_1_ = (char)((uint)uVar19 >> 0x18);
      state.el_info[7].res_level = (short)uVar20;
      state.el_info[7].flags = (char)((uint)uVar20 >> 0x10);
      state.el_info[7]._3_1_ = (char)((uint)uVar20 >> 0x18);
      state.el_info[8].res_level = (short)uVar21;
      state.el_info[8].flags = (char)((uint)uVar21 >> 0x10);
      state.el_info[8]._3_1_ = (char)((uint)uVar21 >> 0x18);
      state.el_info[9].res_level = (short)uVar22;
      state.el_info[9].flags = (char)((uint)uVar22 >> 0x10);
      state.el_info[9]._3_1_ = (char)((uint)uVar22 >> 0x18);
      state.el_info[10].res_level = (short)uVar23;
      state.el_info[10].flags = (char)((uint)uVar23 >> 0x10);
      state.el_info[10]._3_1_ = (char)((uint)uVar23 >> 0x18);
      state.el_info[0xb].res_level = (short)uVar24;
      state.el_info[0xb].flags = (char)((uint)uVar24 >> 0x10);
      state.el_info[0xb]._3_1_ = (char)((uint)uVar24 >> 0x18);
      state.el_info[0xc].res_level = (short)uVar25;
      state.el_info[0xc].flags = (char)((uint)uVar25 >> 0x10);
      state.el_info[0xc]._3_1_ = (char)((uint)uVar25 >> 0x18);
      state.el_info[0xd].res_level = (short)uVar26;
      state.el_info[0xd].flags = (char)((uint)uVar26 >> 0x10);
      state.el_info[0xd]._3_1_ = (char)((uint)uVar26 >> 0x18);
      state.el_info[0xe].res_level = (short)uVar27;
      state.el_info[0xe].flags = (char)((uint)uVar27 >> 0x10);
      state.el_info[0xe]._3_1_ = (char)((uint)uVar27 >> 0x18);
      state.el_info[0xf].res_level = (short)uVar28;
      state.el_info[0xf].flags = (char)((uint)uVar28 >> 0x10);
      state.el_info[0xf]._3_1_ = (char)((uint)uVar28 >> 0x18);
      state.el_info[0x10].res_level = (short)uVar29;
      state.el_info[0x10].flags = (char)((uint)uVar29 >> 0x10);
      state.el_info[0x10]._3_1_ = (char)((uint)uVar29 >> 0x18);
      state.el_info[0x11].res_level = (short)uVar30;
      state.el_info[0x11].flags = (char)((uint)uVar30 >> 0x10);
      state.el_info[0x11]._3_1_ = (char)((uint)uVar30 >> 0x18);
      state.el_info[0x12].res_level = (short)uVar31;
      state.el_info[0x12].flags = (char)((uint)uVar31 >> 0x10);
      state.el_info[0x12]._3_1_ = (char)((uint)uVar31 >> 0x18);
      state.el_info[0x13].res_level = (short)uVar32;
      state.el_info[0x13].flags = (char)((uint)uVar32 >> 0x10);
      state.el_info[0x13]._3_1_ = (char)((uint)uVar32 >> 0x18);
      state.el_info[0x14].res_level = (short)uVar33;
      state.el_info[0x14].flags = (char)((uint)uVar33 >> 0x10);
      state.el_info[0x14]._3_1_ = (char)((uint)uVar33 >> 0x18);
      state.el_info[0x15].res_level = (short)uVar34;
      state.el_info[0x15].flags = (char)((uint)uVar34 >> 0x10);
      state.el_info[0x15]._3_1_ = (char)((uint)uVar34 >> 0x18);
      state.el_info[0x16].res_level = (short)uVar35;
      state.el_info[0x16].flags = (char)((uint)uVar35 >> 0x10);
      state.el_info[0x16]._3_1_ = (char)((uint)uVar35 >> 0x18);
      state.el_info[0x17].res_level = (short)uVar36;
      state.el_info[0x17].flags = (char)((uint)uVar36 >> 0x10);
      state.el_info[0x17]._3_1_ = (char)((uint)uVar36 >> 0x18);
      state.el_info[0x18].res_level = (short)uVar37;
      state.el_info[0x18].flags = (char)((uint)uVar37 >> 0x10);
      state.el_info[0x18]._3_1_ = (char)((uint)uVar37 >> 0x18);
      state.el_info[0x19].res_level = (short)uVar38;
      state.el_info[0x19].flags = (char)((uint)uVar38 >> 0x10);
      state.el_info[0x19]._3_1_ = (char)((uint)uVar38 >> 0x18);
      state.el_info[0x1a].res_level = (short)uVar39;
      state.el_info[0x1a].flags = (char)((uint)uVar39 >> 0x10);
      state.el_info[0x1a]._3_1_ = (char)((uint)uVar39 >> 0x18);
      state.el_info[0x1b].res_level = in_stack_fffffffffffffe58._310_2_;
      _Var4 = player_resists_effects(state,L'\x05');
      ppVar3 = player;
      if (!_Var4) {
        uVar6 = Rand_div(10);
        player_inc_timed(ppVar3,L'\x02',uVar6 + L'\v',true,true,true);
      }
    }
    else if (wVar2 == L'\x06') {
      msg("Darkness seems to crush you!");
      equip_learn_element(player,L'\x06');
      ppVar10 = &player->state;
      puVar11 = (undefined8 *)&stack0xfffffffffffffe58;
      for (lVar9 = 0x27; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar11 = *(undefined8 *)ppVar10->stat_add;
        ppVar10 = (player_state_conflict *)((long)ppVar10 + (ulong)bVar12 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      state_00._312_4_ = *(undefined4 *)&(player->state).el_info[0x1b].flags;
      uVar13 = in_stack_fffffffffffffe58._202_4_;
      uVar14 = in_stack_fffffffffffffe58._206_4_;
      uVar15 = in_stack_fffffffffffffe58._210_4_;
      uVar16 = in_stack_fffffffffffffe58._214_4_;
      uVar17 = in_stack_fffffffffffffe58._218_4_;
      uVar18 = in_stack_fffffffffffffe58._222_4_;
      uVar19 = in_stack_fffffffffffffe58._226_4_;
      uVar20 = in_stack_fffffffffffffe58._230_4_;
      uVar21 = in_stack_fffffffffffffe58._234_4_;
      uVar22 = in_stack_fffffffffffffe58._238_4_;
      uVar23 = in_stack_fffffffffffffe58._242_4_;
      uVar24 = in_stack_fffffffffffffe58._246_4_;
      uVar25 = in_stack_fffffffffffffe58._250_4_;
      uVar26 = in_stack_fffffffffffffe58._254_4_;
      uVar27 = in_stack_fffffffffffffe58._258_4_;
      uVar28 = in_stack_fffffffffffffe58._262_4_;
      uVar29 = in_stack_fffffffffffffe58._266_4_;
      uVar30 = in_stack_fffffffffffffe58._270_4_;
      uVar31 = in_stack_fffffffffffffe58._274_4_;
      uVar32 = in_stack_fffffffffffffe58._278_4_;
      uVar33 = in_stack_fffffffffffffe58._282_4_;
      uVar34 = in_stack_fffffffffffffe58._286_4_;
      uVar35 = in_stack_fffffffffffffe58._290_4_;
      uVar36 = in_stack_fffffffffffffe58._294_4_;
      uVar37 = in_stack_fffffffffffffe58._298_4_;
      uVar38 = in_stack_fffffffffffffe58._302_4_;
      uVar39 = in_stack_fffffffffffffe58._306_4_;
      state_00.stat_add[0] = in_stack_fffffffffffffe58._0_4_;
      state_00.stat_add[1] = in_stack_fffffffffffffe58._4_4_;
      state_00.stat_add[2] = in_stack_fffffffffffffe58._8_4_;
      state_00.stat_add[3] = in_stack_fffffffffffffe58._12_4_;
      state_00.stat_add[4] = in_stack_fffffffffffffe58._16_4_;
      state_00.stat_ind[0] = in_stack_fffffffffffffe58._20_4_;
      state_00.stat_ind[1] = in_stack_fffffffffffffe58._24_4_;
      state_00.stat_ind[2] = in_stack_fffffffffffffe58._28_4_;
      state_00.stat_ind[3] = in_stack_fffffffffffffe58._32_4_;
      state_00.stat_ind[4] = in_stack_fffffffffffffe58._36_4_;
      state_00.stat_use[0] = in_stack_fffffffffffffe58._40_4_;
      state_00.stat_use[1] = in_stack_fffffffffffffe58._44_4_;
      state_00.stat_use[2] = in_stack_fffffffffffffe58._48_4_;
      state_00.stat_use[3] = in_stack_fffffffffffffe58._52_4_;
      state_00.stat_use[4] = in_stack_fffffffffffffe58._56_4_;
      state_00.stat_top[0] = in_stack_fffffffffffffe58._60_4_;
      state_00.stat_top[1] = in_stack_fffffffffffffe58._64_4_;
      state_00.stat_top[2] = in_stack_fffffffffffffe58._68_4_;
      state_00.stat_top[3] = in_stack_fffffffffffffe58._72_4_;
      state_00.stat_top[4] = in_stack_fffffffffffffe58._76_4_;
      state_00.skills[0] = in_stack_fffffffffffffe58._80_4_;
      state_00.skills[1] = in_stack_fffffffffffffe58._84_4_;
      state_00.skills[2] = in_stack_fffffffffffffe58._88_4_;
      state_00.skills[3] = in_stack_fffffffffffffe58._92_4_;
      state_00.skills[4] = in_stack_fffffffffffffe58._96_4_;
      state_00.skills[5] = in_stack_fffffffffffffe58._100_4_;
      state_00.skills[6] = in_stack_fffffffffffffe58._104_4_;
      state_00.skills[7] = in_stack_fffffffffffffe58._108_4_;
      state_00.skills[8] = in_stack_fffffffffffffe58._112_4_;
      state_00.skills[9] = in_stack_fffffffffffffe58._116_4_;
      state_00.speed = in_stack_fffffffffffffe58._120_4_;
      state_00.num_blows = in_stack_fffffffffffffe58._124_4_;
      state_00.num_shots = in_stack_fffffffffffffe58._128_4_;
      state_00.num_moves = in_stack_fffffffffffffe58._132_4_;
      state_00.ammo_mult = in_stack_fffffffffffffe58._136_4_;
      state_00.ammo_tval = in_stack_fffffffffffffe58._140_4_;
      state_00.ac = in_stack_fffffffffffffe58._144_4_;
      state_00.dam_red = in_stack_fffffffffffffe58._148_4_;
      state_00.perc_dam_red = in_stack_fffffffffffffe58._152_4_;
      state_00.to_a = in_stack_fffffffffffffe58._156_4_;
      state_00.to_h = in_stack_fffffffffffffe58._160_4_;
      state_00.to_d = in_stack_fffffffffffffe58._164_4_;
      state_00.see_infra = in_stack_fffffffffffffe58._168_4_;
      state_00.cur_light = in_stack_fffffffffffffe58._172_4_;
      state_00.evasion_chance = in_stack_fffffffffffffe58._176_4_;
      state_00.shield_on_back = (_Bool)in_stack_fffffffffffffe58[0xb4];
      state_00.heavy_wield = (_Bool)in_stack_fffffffffffffe58[0xb5];
      state_00.heavy_shoot = (_Bool)in_stack_fffffffffffffe58[0xb6];
      state_00.bless_wield = (_Bool)in_stack_fffffffffffffe58[0xb7];
      state_00.cumber_armor = (_Bool)in_stack_fffffffffffffe58[0xb8];
      state_00.flags[0] = in_stack_fffffffffffffe58[0xb9];
      state_00.flags[1] = in_stack_fffffffffffffe58[0xba];
      state_00.flags[2] = in_stack_fffffffffffffe58[0xbb];
      state_00.flags[3] = in_stack_fffffffffffffe58[0xbc];
      state_00.flags[4] = in_stack_fffffffffffffe58[0xbd];
      state_00.flags[5] = in_stack_fffffffffffffe58[0xbe];
      state_00.pflags[0] = in_stack_fffffffffffffe58[0xbf];
      state_00.pflags[1] = in_stack_fffffffffffffe58[0xc0];
      state_00.pflags[2] = in_stack_fffffffffffffe58[0xc1];
      state_00.pflags[3] = in_stack_fffffffffffffe58[0xc2];
      state_00.pflags[4] = in_stack_fffffffffffffe58[0xc3];
      state_00.pflags[5] = in_stack_fffffffffffffe58[0xc4];
      state_00.pflags[6] = in_stack_fffffffffffffe58[0xc5];
      state_00.pflags[7] = in_stack_fffffffffffffe58[0xc6];
      state_00.pflags[8] = in_stack_fffffffffffffe58[199];
      state_00.pflags[9] = in_stack_fffffffffffffe58[200];
      state_00._201_1_ = in_stack_fffffffffffffe58[0xc9];
      state_00.el_info[0].res_level = (short)uVar13;
      state_00.el_info[0].flags = (char)((uint)uVar13 >> 0x10);
      state_00.el_info[0]._3_1_ = (char)((uint)uVar13 >> 0x18);
      state_00.el_info[1].res_level = (short)uVar14;
      state_00.el_info[1].flags = (char)((uint)uVar14 >> 0x10);
      state_00.el_info[1]._3_1_ = (char)((uint)uVar14 >> 0x18);
      state_00.el_info[2].res_level = (short)uVar15;
      state_00.el_info[2].flags = (char)((uint)uVar15 >> 0x10);
      state_00.el_info[2]._3_1_ = (char)((uint)uVar15 >> 0x18);
      state_00.el_info[3].res_level = (short)uVar16;
      state_00.el_info[3].flags = (char)((uint)uVar16 >> 0x10);
      state_00.el_info[3]._3_1_ = (char)((uint)uVar16 >> 0x18);
      state_00.el_info[4].res_level = (short)uVar17;
      state_00.el_info[4].flags = (char)((uint)uVar17 >> 0x10);
      state_00.el_info[4]._3_1_ = (char)((uint)uVar17 >> 0x18);
      state_00.el_info[5].res_level = (short)uVar18;
      state_00.el_info[5].flags = (char)((uint)uVar18 >> 0x10);
      state_00.el_info[5]._3_1_ = (char)((uint)uVar18 >> 0x18);
      state_00.el_info[6].res_level = (short)uVar19;
      state_00.el_info[6].flags = (char)((uint)uVar19 >> 0x10);
      state_00.el_info[6]._3_1_ = (char)((uint)uVar19 >> 0x18);
      state_00.el_info[7].res_level = (short)uVar20;
      state_00.el_info[7].flags = (char)((uint)uVar20 >> 0x10);
      state_00.el_info[7]._3_1_ = (char)((uint)uVar20 >> 0x18);
      state_00.el_info[8].res_level = (short)uVar21;
      state_00.el_info[8].flags = (char)((uint)uVar21 >> 0x10);
      state_00.el_info[8]._3_1_ = (char)((uint)uVar21 >> 0x18);
      state_00.el_info[9].res_level = (short)uVar22;
      state_00.el_info[9].flags = (char)((uint)uVar22 >> 0x10);
      state_00.el_info[9]._3_1_ = (char)((uint)uVar22 >> 0x18);
      state_00.el_info[10].res_level = (short)uVar23;
      state_00.el_info[10].flags = (char)((uint)uVar23 >> 0x10);
      state_00.el_info[10]._3_1_ = (char)((uint)uVar23 >> 0x18);
      state_00.el_info[0xb].res_level = (short)uVar24;
      state_00.el_info[0xb].flags = (char)((uint)uVar24 >> 0x10);
      state_00.el_info[0xb]._3_1_ = (char)((uint)uVar24 >> 0x18);
      state_00.el_info[0xc].res_level = (short)uVar25;
      state_00.el_info[0xc].flags = (char)((uint)uVar25 >> 0x10);
      state_00.el_info[0xc]._3_1_ = (char)((uint)uVar25 >> 0x18);
      state_00.el_info[0xd].res_level = (short)uVar26;
      state_00.el_info[0xd].flags = (char)((uint)uVar26 >> 0x10);
      state_00.el_info[0xd]._3_1_ = (char)((uint)uVar26 >> 0x18);
      state_00.el_info[0xe].res_level = (short)uVar27;
      state_00.el_info[0xe].flags = (char)((uint)uVar27 >> 0x10);
      state_00.el_info[0xe]._3_1_ = (char)((uint)uVar27 >> 0x18);
      state_00.el_info[0xf].res_level = (short)uVar28;
      state_00.el_info[0xf].flags = (char)((uint)uVar28 >> 0x10);
      state_00.el_info[0xf]._3_1_ = (char)((uint)uVar28 >> 0x18);
      state_00.el_info[0x10].res_level = (short)uVar29;
      state_00.el_info[0x10].flags = (char)((uint)uVar29 >> 0x10);
      state_00.el_info[0x10]._3_1_ = (char)((uint)uVar29 >> 0x18);
      state_00.el_info[0x11].res_level = (short)uVar30;
      state_00.el_info[0x11].flags = (char)((uint)uVar30 >> 0x10);
      state_00.el_info[0x11]._3_1_ = (char)((uint)uVar30 >> 0x18);
      state_00.el_info[0x12].res_level = (short)uVar31;
      state_00.el_info[0x12].flags = (char)((uint)uVar31 >> 0x10);
      state_00.el_info[0x12]._3_1_ = (char)((uint)uVar31 >> 0x18);
      state_00.el_info[0x13].res_level = (short)uVar32;
      state_00.el_info[0x13].flags = (char)((uint)uVar32 >> 0x10);
      state_00.el_info[0x13]._3_1_ = (char)((uint)uVar32 >> 0x18);
      state_00.el_info[0x14].res_level = (short)uVar33;
      state_00.el_info[0x14].flags = (char)((uint)uVar33 >> 0x10);
      state_00.el_info[0x14]._3_1_ = (char)((uint)uVar33 >> 0x18);
      state_00.el_info[0x15].res_level = (short)uVar34;
      state_00.el_info[0x15].flags = (char)((uint)uVar34 >> 0x10);
      state_00.el_info[0x15]._3_1_ = (char)((uint)uVar34 >> 0x18);
      state_00.el_info[0x16].res_level = (short)uVar35;
      state_00.el_info[0x16].flags = (char)((uint)uVar35 >> 0x10);
      state_00.el_info[0x16]._3_1_ = (char)((uint)uVar35 >> 0x18);
      state_00.el_info[0x17].res_level = (short)uVar36;
      state_00.el_info[0x17].flags = (char)((uint)uVar36 >> 0x10);
      state_00.el_info[0x17]._3_1_ = (char)((uint)uVar36 >> 0x18);
      state_00.el_info[0x18].res_level = (short)uVar37;
      state_00.el_info[0x18].flags = (char)((uint)uVar37 >> 0x10);
      state_00.el_info[0x18]._3_1_ = (char)((uint)uVar37 >> 0x18);
      state_00.el_info[0x19].res_level = (short)uVar38;
      state_00.el_info[0x19].flags = (char)((uint)uVar38 >> 0x10);
      state_00.el_info[0x19]._3_1_ = (char)((uint)uVar38 >> 0x18);
      state_00.el_info[0x1a].res_level = (short)uVar39;
      state_00.el_info[0x1a].flags = (char)((uint)uVar39 >> 0x10);
      state_00.el_info[0x1a]._3_1_ = (char)((uint)uVar39 >> 0x18);
      state_00.el_info[0x1b].res_level = in_stack_fffffffffffffe58._310_2_;
      _Var4 = player_resists_effects(state_00,L'\x06');
      ppVar3 = player;
      if (!_Var4) {
        uVar6 = Rand_div(10);
        player_inc_timed(ppVar3,L'\x02',uVar6 + L'\v',true,true,true);
      }
    }
    player->upkeep->update = player->upkeep->update | 0xc0;
    player->upkeep->redraw = player->upkeep->redraw | 0xc00000;
  }
  return true;
}

Assistant:

bool effect_handler_DESTRUCTION(effect_handler_context_t *context)
{
	int k, r = context->radius;
	int elem = context->subtype;
	int py = player->grid.y;
	int px = player->grid.x;
	struct loc grid;

	context->ident = true;

	/* No effect in town or arena */
	if ((!player->depth) || (player->upkeep->arena_level)) {
		msg("The ground shakes for a moment.");
		return true;
	}

	/* Big area of affect */
	for (grid.y = (py - r); grid.y <= (py + r); grid.y++) {
		for (grid.x = (px - r); grid.x <= (px + r); grid.x++) {
			/* Skip illegal grids */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Extract the distance */
			k = distance(loc(px, py), grid);

			/* Stay in the circle of death */
			if (k > r) continue;

			/* Lose room and vault */
			sqinfo_off(square(cave, grid)->info, SQUARE_ROOM);
			sqinfo_off(square(cave, grid)->info, SQUARE_VAULT);

			/* Forget completely */
			if (!square_isbright(cave, grid)) {
				sqinfo_off(square(cave, grid)->info, SQUARE_GLOW);
			}
			sqinfo_off(square(cave, grid)->info, SQUARE_SEEN);
			square_forget(cave, grid);
			square_light_spot(cave, grid);

			/* Deal with player later */
			if (loc_eq(grid, player->grid)) continue;

			/* Delete the monster (if any) */
			delete_monster(cave, grid);

			/* Destroy any grid that isn't permament */
			if (!square_ispermanent(cave, grid)) {
				/* Deal with artifacts */
				struct object *obj = square_object(cave, grid);
				while (obj) {
					if (obj->artifact) {
						if (OPT(player, birth_lose_arts) ||
							obj_is_known_artifact(obj)) {
							history_lose_artifact(player, obj->artifact);
							mark_artifact_created(
								obj->artifact,
								true);
						} else {
							mark_artifact_created(
								obj->artifact,
								false);
						}
					}
					obj = obj->next;
				}

				/* Delete objects */
				square_excise_all_imagined(player->cave, cave,
					grid);
				square_excise_pile(player->cave, grid);
				square_excise_pile(cave, grid);
				square_destroy(cave, grid);
			}
		}
	}

	/* Player is affected */
	if (elem == ELEM_LIGHT) {
		msg("There is a searing blast of light!");
		equip_learn_element(player, ELEM_LIGHT);
		if (!player_resists_effects(player->state, ELEM_LIGHT)) {
			(void)player_inc_timed(player, TMD_BLIND, 10 + randint1(10), true,
								   true, true);
		}
	} else if (elem == ELEM_DARK) {
		msg("Darkness seems to crush you!");
		equip_learn_element(player, ELEM_DARK);
		if (!player_resists_effects(player->state, ELEM_DARK)) {
			(void)player_inc_timed(player, TMD_BLIND, 10 + randint1(10), true,
								   true, true);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}